

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

void __thiscall
adios2::format::Buffer::Reset(Buffer *this,bool resetAbsolutePosition,bool zeroInitialize)

{
  allocator local_ab;
  allocator local_aa;
  allocator local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"Toolkit",&local_a9);
  std::__cxx11::string::string((string *)&local_48,"format::Buffer",&local_aa);
  std::__cxx11::string::string((string *)&local_68,"Reset",&local_ab);
  std::operator+(&local_a8,"buffer memory of type ",&this->m_Type);
  std::operator+(&local_88,&local_a8," can\'t call Reset");
  helper::Throw<std::invalid_argument>(&local_28,&local_48,&local_68,&local_88,-1);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void Buffer::Reset(const bool resetAbsolutePosition, const bool zeroInitialize)
{
    helper::Throw<std::invalid_argument>("Toolkit", "format::Buffer", "Reset",
                                         "buffer memory of type " + m_Type + " can't call Reset");
}